

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:542:45)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:542:45)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  int iVar2;
  float fVar3;
  Vec3f dp;
  Vec3f p;
  _Any_data local_58;
  pointer local_48;
  pointer ppStack_40;
  Ref<embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  pointer ppStack_30;
  Ref<embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  undefined8 uStack_20;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)&p);
  ParseStream::getVec3f((ParseStream *)&dp);
  fVar3 = ParseStream::getFloat(this_00);
  iVar2 = ParseStream::getInt(this_00);
  local_38.ptr = (Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)p.field_0._0_8_;
  ppStack_30 = (pointer)0x0;
  local_28.ptr = (Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)dp.field_0._0_8_;
  uStack_20 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48 = (pointer)0x0;
  ppStack_40 = (pointer)0x0;
  local_58._M_unused._M_object = ::operator_new(0x30);
  *(Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> **)
   local_58._M_unused._0_8_ = local_38.ptr;
  *(float *)((long)local_58._M_unused._0_8_ + 8) = p.field_0.field_0.z;
  *(float *)((long)local_58._M_unused._0_8_ + 0xc) = fVar3;
  *(long *)((long)local_58._M_unused._0_8_ + 0x10) = (long)iVar2;
  *(Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> **)
   ((long)local_58._M_unused._0_8_ + 0x18) = local_28.ptr;
  *(float *)((long)local_58._M_unused._0_8_ + 0x20) = dp.field_0.field_0.z;
  *(SceneLoadingTutorialApplication **)((long)local_58._M_unused._0_8_ + 0x28) = pSVar1;
  ppStack_40 = (pointer)std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:547:27)>
                        ::_M_invoke;
  local_48 = (pointer)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:547:27)>
                      ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar1->futures
             ,(function<void_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }